

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_node_choice(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  byte *pbVar1;
  long lVar2;
  lysp_node *name;
  LY_ERR LVar3;
  char *pcVar4;
  lys_module *module;
  long *plVar5;
  lysc_node *plVar6;
  lysc_node *plVar7;
  lysp_node *plVar8;
  
  if (node->nodetype != 2) {
    __assert_fail("node->nodetype == LYS_CHOICE",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0xe7e,
                  "LY_ERR lys_compile_node_choice(struct lysc_ctx *, struct lysp_node *, struct lysc_node *)"
                 );
  }
  plVar8 = pnode + 1;
  while (plVar8 = plVar8->parent, plVar8 != (lysp_node *)0x0) {
    LVar3 = lys_compile_node_choice_child(ctx,plVar8,node,(ly_set *)0x0);
    plVar8 = (lysp_node *)&plVar8->next;
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
  }
  LVar3 = lys_compile_node_augments(ctx,node);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  plVar8 = pnode[1].next;
  if (plVar8 == (lysp_node *)0x0) {
LAB_00148e99:
    LVar3 = LY_SUCCESS;
  }
  else {
    pcVar4 = strchr((char *)plVar8,0x3a);
    if (pcVar4 == (char *)0x0) {
      module = node->module;
      name = plVar8;
LAB_00148e50:
      plVar6 = lys_find_child(node,module,(char *)name,0,0x80,4);
      node[1].parent = plVar6;
      if (plVar6 == (lysc_node *)0x0) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Default case \"%s\" not found.",pnode[1].next);
      }
      else {
        plVar7 = plVar6 + 1;
        while ((lVar2 = *(long *)plVar7, lVar2 != 0 && (*(lysc_node **)(lVar2 + 0x10) == plVar6))) {
          if ((*(byte *)(lVar2 + 2) & 0x20) != 0) {
            ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                    "Mandatory node \"%s\" under the default case \"%s\".",
                    *(undefined8 *)(lVar2 + 0x28),pnode[1].next);
            goto LAB_00148f15;
          }
          plVar7 = (lysc_node *)(lVar2 + 0x18);
        }
        if ((node->flags & 0x20) == 0) {
          pbVar1 = (byte *)((long)&plVar6->flags + 1);
          *pbVar1 = *pbVar1 | 2;
          goto LAB_00148e99;
        }
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid mandatory choice with a default case.")
        ;
      }
    }
    else {
      module = ly_resolve_prefix(ctx->ctx,plVar8,(long)pcVar4 - (long)plVar8,LY_VALUE_SCHEMA,
                                 pnode[1].name);
      name = (lysp_node *)(pcVar4 + 1);
      if (module != (lys_module *)0x0) goto LAB_00148e50;
      plVar5 = (long *)pnode[1].name;
      if ((*(byte *)((long)plVar5 + 0x79) & 2) == 0) {
        plVar5 = (long *)(*plVar5 + 8);
      }
      else {
        plVar5 = plVar5 + 0x10;
      }
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "Default case prefix \"%.*s\" not found in imports of \"%s\".",
              (long)pcVar4 - (long)plVar8 & 0xffffffff,plVar8,*plVar5);
    }
LAB_00148f15:
    LVar3 = LY_EVALID;
  }
  return LVar3;
}

Assistant:

static LY_ERR
lys_compile_node_choice(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_choice *ch_p = (struct lysp_node_choice *)pnode;
    struct lysc_node_choice *ch = (struct lysc_node_choice *)node;
    struct lysp_node *child_p;
    LY_ERR ret = LY_SUCCESS;

    assert(node->nodetype == LYS_CHOICE);

    LY_LIST_FOR(ch_p->child, child_p) {
        LY_CHECK_GOTO(ret = lys_compile_node_choice_child(ctx, child_p, node, NULL), done);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    /* default branch */
    if (ch_p->dflt.str) {
        LY_CHECK_GOTO(ret = lys_compile_node_choice_dflt(ctx, &ch_p->dflt, ch), done);
    }

done:
    return ret;
}